

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O0

U32 __thiscall USBPacket::GetDataPayload(USBPacket *this,int offset,int bcnt)

{
  value_type vVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  const_reference pvVar6;
  uint local_1c;
  U32 ret_val;
  int bcnt_local;
  int offset_local;
  USBPacket *this_local;
  
  local_1c = 0;
  if (bcnt == 1) {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 2));
    local_1c = (uint)*pbVar5;
  }
  else if (bcnt == 2) {
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 3));
    vVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 2));
    local_1c = (uint)CONCAT11(vVar1,*pvVar6);
  }
  else if (bcnt == 3) {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 4));
    bVar2 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 3));
    bVar3 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 2));
    local_1c = (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)*pbVar5;
  }
  else if (bcnt == 4) {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 5));
    bVar2 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 4));
    bVar3 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 3));
    bVar4 = *pbVar5;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->mData,(long)(offset + 2));
    local_1c = (uint)bVar2 << 0x18 | (uint)bVar3 << 0x10 | (uint)bVar4 << 8 | (uint)*pbVar5;
  }
  return local_1c;
}

Assistant:

U32 USBPacket::GetDataPayload( int offset, int bcnt ) const
{
    U32 ret_val = 0;

    if( bcnt == 1 )
        ret_val = mData[ offset + 2 ];
    else if( bcnt == 2 )
        ret_val = ( mData[ offset + 3 ] << 8 ) | mData[ offset + 2 ];
    else if( bcnt == 3 )
        ret_val = ( mData[ offset + 4 ] << 16 ) | ( mData[ offset + 3 ] << 8 ) | mData[ offset + 2 ];
    else if( bcnt == 4 )
        ret_val = ( mData[ offset + 5 ] << 24 ) | ( mData[ offset + 4 ] << 16 ) | ( mData[ offset + 3 ] << 8 ) | mData[ offset + 2 ];

    return ret_val;
}